

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int aKey,ByteArray *aValue,int aFlags)

{
  uint8_t *data;
  uint8_t *puVar1;
  char *pcVar2;
  cn_cbor *value;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar5;
  format_args args;
  format_args args_00;
  writer write;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  writer local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  local_a0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_a0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  data = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (data == puVar1) {
    local_68._0_4_ = none_type;
    pcVar4 = "add empty COSE SIGN1 message attribute";
    local_60._M_p = "add empty COSE SIGN1 message attribute";
    local_58 = 0x26;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    local_98.handler_ = (format_string_checker<char> *)local_68;
    local_50._8_8_ = (format_string_checker<char> *)local_68;
    do {
      if (pcVar4 == "") break;
      pcVar3 = pcVar4;
      if (*pcVar4 == '{') {
LAB_001dd5b7:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar4,pcVar3);
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",(format_string_checker<char> *)local_68);
        bVar5 = true;
      }
      else {
        pcVar3 = pcVar4 + 1;
        bVar5 = pcVar3 != "";
        if (bVar5) {
          if (*pcVar3 != '{') {
            pcVar2 = pcVar4 + 2;
            do {
              pcVar3 = pcVar2;
              bVar5 = pcVar3 != "";
              if (pcVar3 == "") goto LAB_001dd5b3;
              pcVar2 = pcVar3 + 1;
            } while (*pcVar3 != '{');
          }
          bVar5 = true;
        }
LAB_001dd5b3:
        if (bVar5) goto LAB_001dd5b7;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar4,"");
        bVar5 = false;
      }
    } while (bVar5);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"add empty COSE SIGN1 message attribute",(string_view)ZEXT816(0x26),
               args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
  }
  else {
    value = cn_cbor_data_create(data,(int)puVar1 - (int)data,(cn_cbor_errback *)0x0);
    if (value != (cn_cbor *)0x0) {
      AddAttribute((Error *)local_68,this,aKey,value,aFlags);
      __return_storage_ptr__->mCode = local_68._0_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p);
      }
      goto LAB_001dd775;
    }
    local_68._0_4_ = none_type;
    pcVar4 = "add COSE SIGN1 message attribute";
    local_60._M_p = "add COSE SIGN1 message attribute";
    local_58 = 0x20;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    local_98.handler_ = (format_string_checker<char> *)local_68;
    local_50._8_8_ = (format_string_checker<char> *)local_68;
    do {
      if (pcVar4 == "") break;
      pcVar3 = pcVar4;
      if (*pcVar4 == '{') {
LAB_001dd6bc:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar4,pcVar3);
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",(format_string_checker<char> *)local_68);
        bVar5 = true;
      }
      else {
        pcVar3 = pcVar4 + 1;
        bVar5 = pcVar3 != "";
        if (bVar5) {
          if (*pcVar3 != '{') {
            pcVar2 = pcVar4 + 2;
            do {
              pcVar3 = pcVar2;
              bVar5 = pcVar3 != "";
              if (pcVar3 == "") goto LAB_001dd6b8;
              pcVar2 = pcVar3 + 1;
            } while (*pcVar3 != '{');
          }
          bVar5 = true;
        }
LAB_001dd6b8:
        if (bVar5) goto LAB_001dd6bc;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_98,pcVar4,"");
        bVar5 = false;
      }
    } while (bVar5);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"add COSE SIGN1 message attribute",(string_view)ZEXT816(0x20),
               args_00);
    local_90 = kOutOfMemory;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
  }
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  value = (cn_cbor *)0x0;
LAB_001dd775:
  if ((value != (cn_cbor *)0x0) && (value->parent == (cn_cbor *)0x0)) {
    cn_cbor_free(value);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int aKey, const ByteArray &aValue, int aFlags)
{
    Error    error;
    cn_cbor *cbor = nullptr;

    VerifyOrExit(!aValue.empty(), error = ERROR_INVALID_ARGS("add empty COSE SIGN1 message attribute"));
    cbor = cn_cbor_data_create(&aValue[0], aValue.size(), nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(aKey, cbor, aFlags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}